

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

DictionaryTypeHandlerBase<unsigned_short> * __thiscall
Js::PathTypeHandlerBase::ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>
          (PathTypeHandlerBase *this,DynamicObject *instance)

{
  byte bVar1;
  ushort uVar2;
  ScriptContext *scriptContext;
  Recycler *this_00;
  DynamicType *oldType;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  bool usedAsFixed;
  PropertyTypes values;
  unsigned_short uVar6;
  int iVar7;
  undefined4 *puVar8;
  PathTypeHandlerBase *this_01;
  Recycler *alloc;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar9;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  RecyclerWeakReference<Js::DynamicObject> *pRVar10;
  undefined4 extraout_var;
  PropertyRecord *propertyRecord;
  char *pcVar12;
  TypePath *pTVar13;
  ulong uVar14;
  bool isInitialized;
  undefined1 local_c8 [8];
  TrackAllocData data;
  int i;
  DictionaryPropertyDescriptor<unsigned_short> *local_60;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  Type *local_50;
  uint local_44;
  DictionaryTypeHandlerBase<unsigned_short> *local_40;
  char local_31;
  long lVar11;
  
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x596,"(instance)","instance");
    if (!bVar4) goto LAB_00dc6ee7;
    *puVar8 = 0;
  }
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = scriptContext->recycler;
  (*(instance->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x68])(instance);
  bVar4 = DynamicObject::DeoptimizeObjectHeaderInlining(instance);
  this_01 = this;
  if ((bVar4) &&
     (this_01 = (PathTypeHandlerBase *)DynamicObject::GetTypeHandler(instance),
     this_01 == (PathTypeHandlerBase *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5ae,"(oldTypeHandler)","oldTypeHandler");
    if (!bVar4) goto LAB_00dc6ee7;
    *puVar8 = 0;
    this_01 = (PathTypeHandlerBase *)0x0;
  }
  local_c8 = (undefined1  [8])&DictionaryTypeHandlerBase<unsigned_short>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9d226db;
  data.filename._0_4_ = 0x5b0;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_c8);
  pDVar9 = (DictionaryTypeHandlerBase<unsigned_short> *)new<Memory::Recycler>(0x30,alloc,0x387914);
  DictionaryTypeHandlerBase<unsigned_short>::DictionaryTypeHandlerBase
            (pDVar9,this_00,(this_01->super_DynamicTypeHandler).slotCapacity,
             (this_01->super_DynamicTypeHandler).inlineSlotCapacity,
             (this_01->super_DynamicTypeHandler).offsetOfInlineSlots);
  local_40 = pDVar9;
  bVar5 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)pDVar9);
  if ((bVar5 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5b2,"(newTypeHandler->GetHasOnlyWritableDataProperties())",
                                "newTypeHandler->GetHasOnlyWritableDataProperties()");
    if (!bVar4) goto LAB_00dc6ee7;
    *puVar8 = 0;
  }
  oldType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  bVar4 = HasSingletonInstance(this_01);
  if (bVar4) {
    oldSingletonInstanceBefore = (((this_01->typePath).ptr)->singletonInstance).ptr;
  }
  else {
    oldSingletonInstanceBefore = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  }
  pcVar12 = (char *)instance;
  TraceFixedFieldsBeforeTypeHandlerChange
            (L"converting",L"PathTypeHandler",L"DictionaryTypeHandler",instance,
             &this_01->super_DynamicTypeHandler,oldType,oldSingletonInstanceBefore);
  local_31 = DynamicTypeHandler::CanBeSingletonInstance(instance);
  if ((!(bool)local_31) && (bVar4 = HasSingletonInstance(this_01), bVar4)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    pcVar12 = "canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance()";
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5bd,
                                "(canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance())"
                                ,"canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance()"
                               );
    if (!bVar4) goto LAB_00dc6ee7;
    *puVar8 = 0;
  }
  bVar4 = DynamicTypeHandler::ShouldFixAnyProperties();
  if ((!bVar4) &&
     ((((this_01->typePath).ptr)->singletonInstance).ptr !=
      (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    pcVar12 = "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()";
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5c9,"(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
    if (!bVar4) goto LAB_00dc6ee7;
    *puVar8 = 0;
  }
  if ((local_31 != '\0') && (bVar4 = DynamicTypeHandler::ShouldFixAnyProperties(), bVar4)) {
    pRVar10 = (((this_01->typePath).ptr)->singletonInstance).ptr;
    if ((pRVar10 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) ||
       ((DynamicObject *)(pRVar10->super_RecyclerWeakReferenceBase).strongRef != instance)) {
      pRVar10 = DynamicObject::CreateWeakReferenceToSelf(instance);
    }
    DynamicTypeHandler::SetSingletonInstance(&local_40->super_DynamicTypeHandler,pRVar10);
  }
  if ((DAT_015bf345 == '\x01') && (((this_01->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    pcVar12 = 
    "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
    ;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x5df,
                                "(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar4) goto LAB_00dc6ee7;
    *puVar8 = 0;
  }
  bVar5 = (this_01->super_DynamicTypeHandler).flags;
  local_44 = (uint)CONCAT71((int7)((ulong)pcVar12 >> 8),1);
  if ((bVar5 & 0x20) == 0) {
    if ((bVar5 & 0x18) == 0) {
      local_44 = 0;
    }
    else {
      local_44 = (uint)CONCAT71(0x15932,DAT_015bf345) ^ 1;
    }
  }
  iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
  lVar11 = CONCAT44(extraout_var,iVar7);
  if (1 < (this_01->super_DynamicTypeHandler).unusedBytes) {
    pTVar13 = (this_01->typePath).ptr;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_50 = &local_40->nextPropertyIndex;
    uVar14 = 0;
    descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)pTVar13;
    do {
      if (lVar11 == 0) {
        bVar5 = 7;
      }
      else {
        bVar5 = *(byte *)(lVar11 + uVar14);
      }
      if (uVar14 < ((pTVar13->data).ptr)->pathLength) {
        propertyRecord = TypePath::GetPropertyIdUnchecked(pTVar13,(int)uVar14);
      }
      else {
        propertyRecord = (PropertyRecord *)0x0;
      }
      local_c8 = (undefined1  [8])propertyRecord;
      if (bVar5 == 0xf7) {
        bVar4 = JsUtil::
                BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::TryGetReference<Js::PropertyRecord_const*>
                          ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                            *)(local_40->propertyMap).ptr,(PropertyRecord **)local_c8,&local_60,
                           (int *)&data.field_0x24);
        pTVar13 = (TypePath *)descriptor;
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0x5ef,"(result)","result");
          if (!bVar4) goto LAB_00dc6ee7;
          *puVar8 = 0;
        }
        uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(local_60);
        if ((*(byte *)(lVar11 + (ulong)uVar6) & 0x10) == 0) {
          uVar2 = *local_50;
          if (uVar14 != uVar2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                        ,0x5f4,"(i == newTypeHandler->nextPropertyIndex)",
                                        "i == newTypeHandler->nextPropertyIndex");
            if (!bVar4) goto LAB_00dc6ee7;
            *puVar8 = 0;
            uVar2 = *local_50;
          }
          if (uVar2 == 0xffff) {
            ::Math::DefaultOverflowPolicy();
          }
          *local_50 = uVar2 + 1;
        }
        else {
          uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                            (local_60);
          iVar7 = (*(this_01->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x70])
                            (this_01,(ulong)uVar6);
          if (*local_50 != ((ushort)iVar7 & 0xff)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                        ,0x5f8,
                                        "(oldTypeHandler->GetSetterSlotIndex(descriptor->GetDataPropertyIndex<false>()) == newTypeHandler->nextPropertyIndex)"
                                        ,
                                        "oldTypeHandler->GetSetterSlotIndex(descriptor->GetDataPropertyIndex<false>()) == newTypeHandler->nextPropertyIndex"
                                       );
            if (!bVar4) goto LAB_00dc6ee7;
            *puVar8 = 0;
          }
          DictionaryPropertyDescriptor<unsigned_short>::ConvertToGetterSetter(local_60,local_50);
          DynamicTypeHandler::SetHasOnlyWritableDataProperties
                    (&local_40->super_DynamicTypeHandler,false);
        }
      }
      else {
        if (DAT_015bf361 == '\x01') {
          bVar1 = *(byte *)((long)*descriptor + 0x20);
          if (local_31 == '\0') {
            bVar4 = false;
          }
          else {
            bVar4 = TypePath::GetIsFixedFieldAt
                              ((TypePath *)descriptor,(PropertyIndex)uVar14,
                               (uint)((this_01->super_DynamicTypeHandler).unusedBytes >> 1));
          }
          if ((char)local_44 == '\0') {
            usedAsFixed = false;
          }
          else {
            usedAsFixed = TypePath::GetIsUsedFixedFieldAt
                                    ((TypePath *)descriptor,(PropertyIndex)uVar14,
                                     (uint)((this_01->super_DynamicTypeHandler).unusedBytes >> 1));
          }
          isInitialized = uVar14 < bVar1;
        }
        else {
          isInitialized = true;
          bVar4 = false;
          usedAsFixed = false;
        }
        DictionaryTypeHandlerBase<unsigned_short>::Add
                  (local_40,propertyRecord,bVar5 & 0xf,isInitialized,bVar4,usedAsFixed,scriptContext
                  );
        pTVar13 = (TypePath *)descriptor;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (this_01->super_DynamicTypeHandler).unusedBytes >> 1);
  }
  if (DAT_015bf361 != '\0') {
    bVar4 = DynamicTypeHandler::ShouldFixAnyProperties();
    pTVar13 = (this_01->typePath).ptr;
    if ((!bVar4) &&
       ((pTVar13->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x616,"(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                  "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar4) goto LAB_00dc6ee7;
      *puVar8 = 0;
      pTVar13 = (this_01->typePath).ptr;
    }
    pRVar10 = (pTVar13->singletonInstance).ptr;
    if ((pRVar10 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
       ((DynamicObject *)(pRVar10->super_RecyclerWeakReferenceBase).strongRef == instance)) {
      (pTVar13->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
    }
  }
  if ((DAT_015bf345 == '\x01') && (((this_01->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x61d,
                                "(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar4) goto LAB_00dc6ee7;
    *puVar8 = 0;
  }
  if (((local_40->super_DynamicTypeHandler).flags & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x61e,"(!newTypeHandler->GetIsPrototype())",
                                "Why did we create a brand new type handler with a prototype flag set?"
                               );
    if (!bVar4) goto LAB_00dc6ee7;
    *puVar8 = 0;
  }
  pDVar9 = local_40;
  DynamicTypeHandler::SetFlags
            (&local_40->super_DynamicTypeHandler,(this_01->super_DynamicTypeHandler).flags & 0x20);
  if (((pDVar9->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x623,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar4) goto LAB_00dc6ee7;
    *puVar8 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes(&this_01->super_DynamicTypeHandler);
  pcVar12 = (char *)local_40;
  DynamicTypeHandler::SetPropertyTypes(&local_40->super_DynamicTypeHandler,0xb0,values);
  DynamicTypeHandler::SetInstanceTypeHandler((DynamicTypeHandler *)pcVar12,instance,true);
  bVar4 = DictionaryTypeHandlerBase<unsigned_short>::HasSingletonInstance
                    ((DictionaryTypeHandlerBase<unsigned_short> *)pcVar12);
  if ((bVar4) && (pcVar12 = (char *)instance, bVar4 = DynamicObject::HasSharedType(instance), bVar4)
     ) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    pcVar12 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
    ;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x628,
                                "(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType())"
                                ,
                                "!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType()"
                               );
    if (!bVar4) {
LAB_00dc6ee7:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  pDVar9 = local_40;
  TraceFixedFieldsAfterTypeHandlerChange
            ((DynamicObject *)pcVar12,&this_01->super_DynamicTypeHandler,
             &local_40->super_DynamicTypeHandler,oldType,
             (DynamicType *)(instance->super_RecyclableObject).type.ptr,oldSingletonInstanceBefore);
  return pDVar9;
}

Assistant:

T* PathTypeHandlerBase::ConvertToTypeHandler(DynamicObject* instance)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        instance->PrepareForConversionToNonPathType();

        PathTypeHandlerBase * oldTypeHandler;

        // Ideally 'this' and oldTypeHandler->GetTypeHandler() should be same
        // But we can have calls from external DOM objects, which requests us to replace the type of the
        // object with a new type. And in such cases, this API gets called with oldTypeHandler and the
        // new type (obtained from the External DOM object)
        // We use the duplicated typeHandler, if we deOptimized the object successfully, else we retain the earlier
        // behavior of using 'this' pointer.

        if (instance->DeoptimizeObjectHeaderInlining())
        {
            oldTypeHandler = reinterpret_cast<PathTypeHandlerBase *>(instance->GetTypeHandler());
        }
        else
        {
            oldTypeHandler = this;
        }

        Assert(oldTypeHandler);

        T* newTypeHandler = RecyclerNew(recycler, T, recycler, oldTypeHandler->GetSlotCapacity(), oldTypeHandler->GetInlineSlotCapacity(), oldTypeHandler->GetOffsetOfInlineSlots());
        // We expect the new type handler to start off marked as having only writable data properties.
        Assert(newTypeHandler->GetHasOnlyWritableDataProperties());

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldType = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = oldTypeHandler->GetSingletonInstance();
        oldTypeHandler->TraceFixedFieldsBeforeTypeHandlerChange(_u("converting"), _u("PathTypeHandler"), _u("DictionaryTypeHandler"), instance, oldTypeHandler, oldType, oldSingletonInstance);
#endif

        bool const canBeSingletonInstance = DynamicTypeHandler::CanBeSingletonInstance(instance);
        // If this type had been installed on a stack instance it shouldn't have a singleton Instance
        Assert(canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance());

        // This instance may not be the singleton instance for this handler. There may be a singleton at the tip
        // and this instance may be getting initialized via an object literal and one of the properties may
        // be an accessor.  In this case we will convert to a DictionaryTypeHandler and it's correct to
        // transfer this instance, even tough different from the singleton. Ironically, this instance
        // may even appear to be at the tip along with the other singleton, because the set of properties (by
        // name, not value) may be identical.
        // Consider: Consider threading PropertyOperation_Init through InitProperty and SetAccessors,
        // to be sure that we don't assert only in this narrow case.
        // Assert(this->typePath->GetSingletonInstance() == instance);

        Assert(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded());

        // Don't install stack instance as singleton instance
        if (canBeSingletonInstance)
        {
            if (DynamicTypeHandler::AreSingletonInstancesNeeded())
            {
                RecyclerWeakReference<DynamicObject>* curSingletonInstance = oldTypeHandler->GetTypePath()->GetSingletonInstance();
                if (curSingletonInstance != nullptr && curSingletonInstance->Get() == instance)
                {
                    newTypeHandler->SetSingletonInstance(curSingletonInstance);
                }
                else
                {
                    newTypeHandler->SetSingletonInstance(instance->CreateWeakReferenceToSelf());
                }
            }
        }

        bool transferFixed = canBeSingletonInstance;

        // If we are a prototype or may become a prototype we must transfer used as fixed bits.  See point 4 in ConvertToSimpleDictionaryType.
        Assert(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0));
        bool transferUsedAsFixed = ((oldTypeHandler->GetFlags() & IsPrototypeFlag) != 0 || (oldTypeHandler->GetIsOrMayBecomeShared() && !DynamicTypeHandler::IsolatePrototypes()));
#endif

        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        TypePath * typePath = oldTypeHandler->GetTypePath();
        for (PropertyIndex i = 0; i < oldTypeHandler->GetPathLength(); i++)
        {
            ObjectSlotAttributes attr = attributes ? attributes[i] : ObjectSlotAttr_Default;
            const PropertyRecord * propertyRecord = typePath->GetPropertyId(i);
            if (attr == ObjectSlotAttr_Setter)
            {
                // Adding a setter. Don't add another descriptor. Find the getter and convert its descriptor, which will cause
                // the setter to get the next free slot.
                DictionaryPropertyDescriptor<PropertyIndex> *descriptor;
                bool result = newTypeHandler->propertyMap->TryGetReference(propertyRecord, &descriptor);
                Assert(result);
                if (!(attributes[descriptor->GetDataPropertyIndex<false>()] & ObjectSlotAttr_Accessor))
                {
                    // Setter without a getter; this is a stale entry, so ignore it
                    // Just consume the slot so no descriptor refers to it.
                    Assert(i == newTypeHandler->nextPropertyIndex);
                    ::Math::PostInc(newTypeHandler->nextPropertyIndex);
                    continue;
                }
                Assert(oldTypeHandler->GetSetterSlotIndex(descriptor->GetDataPropertyIndex<false>()) == newTypeHandler->nextPropertyIndex);
                descriptor->ConvertToGetterSetter(newTypeHandler->nextPropertyIndex);
                newTypeHandler->ClearHasOnlyWritableDataProperties();
            }
            else
            {
#if ENABLE_FIXED_FIELDS
                // Consider: As noted in point 2 in ConvertToSimpleDictionaryType, when converting to non-shared handler we could be more
                // aggressive and mark every field as fixed, because we will always take a type transition. We have to remember to respect
                // the switches as to which kinds of properties we should fix, and for that we need the values from the instance. Even if
                // the type handler says the property is initialized, the current instance may not have a value for it. Check for value != null.
                if (PathTypeHandlerBase::FixPropsOnPathTypes())
                {
                    newTypeHandler->Add(propertyRecord, ObjectSlotAttributesToPropertyAttributes(attr),
                        i < typePath->GetMaxInitializedLength(),
                        transferFixed && typePath->GetIsFixedFieldAt(i, oldTypeHandler->GetPathLength()),
                        transferUsedAsFixed && typePath->GetIsUsedFixedFieldAt(i, oldTypeHandler->GetPathLength()),
                        scriptContext);
                }
                else
#endif
                {
                    newTypeHandler->Add(propertyRecord, ObjectSlotAttributesToPropertyAttributes(attr), true, false, false, scriptContext);
                }
            }
        }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        if (PathTypeHandlerBase::FixPropsOnPathTypes())
        {
            Assert(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded());
            oldTypeHandler->GetTypePath()->ClearSingletonInstanceIfSame(instance);
        }
#endif

        // PathTypeHandlers are always shared, so if we're isolating prototypes, a PathTypeHandler should
        // never have the prototype flag set.
        Assert(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0));
        AssertMsg(!newTypeHandler->GetIsPrototype(), "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, oldTypeHandler->GetFlags());

        // Any new type handler we expect to see here should have inline slot capacity locked.  If this were to change, we would need
        // to update our shrinking logic (see ShrinkSlotAndInlineSlotCapacity).
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, oldTypeHandler->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

#if ENABLE_FIXED_FIELDS
        Assert(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        PathTypeHandlerBase::TraceFixedFieldsAfterTypeHandlerChange(instance, oldTypeHandler, newTypeHandler, oldType, instance->GetDynamicType(), oldSingletonInstance);
#endif
#endif

        return newTypeHandler;
    }